

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O2

png_fixed_point convert_gamma_value(png_structrp png_ptr,double output_gamma)

{
  double dVar1;
  
  dVar1 = floor((double)(~-(ulong)(0.0 < output_gamma) & (ulong)output_gamma |
                        (~-(ulong)(output_gamma < 128.0) & (ulong)output_gamma |
                        (ulong)(output_gamma * 100000.0) & -(ulong)(output_gamma < 128.0)) &
                        -(ulong)(0.0 < output_gamma)) + 0.5);
  if (ABS(dVar1) <= 2147483647.0) {
    return (int)dVar1;
  }
  png_fixed_error(png_ptr,"gamma value");
}

Assistant:

static png_fixed_point
convert_gamma_value(png_structrp png_ptr, double output_gamma)
{
   /* The following silently ignores cases where fixed point (times 100,000)
    * gamma values are passed to the floating point API.  This is safe and it
    * means the fixed point constants work just fine with the floating point
    * API.  The alternative would just lead to undetected errors and spurious
    * bug reports.  Negative values fail inside the _fixed API unless they
    * correspond to the flag values.
    */
   if (output_gamma > 0 && output_gamma < 128)
      output_gamma *= PNG_FP_1;

   /* This preserves -1 and -2 exactly: */
   output_gamma = floor(output_gamma + .5);

   if (output_gamma > PNG_FP_MAX || output_gamma < PNG_FP_MIN)
      png_fixed_error(png_ptr, "gamma value");

   return (png_fixed_point)output_gamma;
}